

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall hgdb::json::Variable::serialize(Variable *this,JSONWriter *w)

{
  JSONWriter *pJVar1;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pJVar1 = JSONWriter::begin_obj(w);
  name._M_str = "name";
  name._M_len = 4;
  pJVar1 = JSONWriter::key(pJVar1,name);
  std::__cxx11::string::string((string *)&local_88,(string *)this);
  pJVar1 = JSONWriter::value<std::__cxx11::string>(pJVar1,&local_88);
  name_00._M_str = "value";
  name_00._M_len = 5;
  pJVar1 = JSONWriter::key(pJVar1,name_00);
  std::__cxx11::string::string((string *)&local_48,(string *)&this->value);
  pJVar1 = JSONWriter::value<std::__cxx11::string>(pJVar1,&local_48);
  name_01._M_str = "rtl";
  name_01._M_len = 3;
  pJVar1 = JSONWriter::key(pJVar1,name_01);
  JSONWriter::value<bool>(pJVar1,this->rtl);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  if ((this->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    name_02._M_str = "id";
    name_02._M_len = 2;
    pJVar1 = JSONWriter::key(w,name_02);
    std::__cxx11::to_string
              (&local_68,
               (this->id).super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload._M_value);
    JSONWriter::value<std::__cxx11::string>(pJVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  JSONWriter::end_obj(w);
  return;
}

Assistant:

void serialize(JSONWriter &w) const {
        w.begin_obj().key("name").value(name).key("value").value(value).key("rtl").value(rtl);
        if (id) {
            w.key("id").value(std::to_string(*id));
        }
        w.end_obj();
    }